

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vis.c
# Opt level: O0

wchar_t * do_hvis(wchar_t *dst,wint_t c,wchar_t flags,wint_t nextc,wchar_t *extra)

{
  int iVar1;
  wchar_t *extra_local;
  wint_t nextc_local;
  wchar_t flags_local;
  wint_t c_local;
  wchar_t *dst_local;
  
  iVar1 = iswalnum(c);
  if (((((iVar1 == 0) && (c != 0x24)) && (c != 0x2d)) &&
      ((((c != 0x5f && (c != 0x2e)) && ((c != 0x2b && ((c != 0x21 && (c != 0x2a)))))) && (c != 0x27)
       ))) && (((c != 0x28 && (c != 0x29)) && (c != 0x2c)))) {
    *dst = L'%';
    dst[1] = L"0123456789abcdef"[c >> 4 & 0xf];
    _flags_local = dst + 3;
    dst[2] = L"0123456789abcdef"[c & 0xf];
  }
  else {
    _flags_local = do_svis(dst,c,flags,nextc,extra);
  }
  return _flags_local;
}

Assistant:

static wchar_t *
do_hvis(wchar_t *dst, wint_t c, int flags, wint_t nextc, const wchar_t *extra)
{
	if (iswalnum(c)
	    /* safe */
	    || c == L'$' || c == L'-' || c == L'_' || c == L'.' || c == L'+'
	    /* extra */
	    || c == L'!' || c == L'*' || c == L'\'' || c == L'(' || c == L')'
	    || c == L',')
		dst = do_svis(dst, c, flags, nextc, extra);
	else {
		*dst++ = L'%';
		*dst++ = xtoa(((unsigned int)c >> 4) & 0xf);
		*dst++ = xtoa((unsigned int)c & 0xf);
	}

	return dst;
}